

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableFieldGenerator::GenerateParsingCodeFromPacked
          (ImmutableFieldGenerator *this,Printer *printer)

{
  LogMessage *pLVar1;
  LogFinisher local_41;
  LogMessage local_40;
  
  internal::LogMessage::LogMessage
            (&local_40,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.cc"
             ,0xdf);
  pLVar1 = internal::LogMessage::operator<<(&local_40,"GenerateParsingCodeFromPacked() ");
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,"called on field generator that does not support packing.");
  internal::LogFinisher::operator=(&local_41,pLVar1);
  internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

static inline void ReportUnexpectedPackedFieldsCall(io::Printer* printer) {
  // Reaching here indicates a bug. Cases are:
  //   - This FieldGenerator should support packing,
  //     but this method should be overridden.
  //   - This FieldGenerator doesn't support packing, and this method
  //     should never have been called.
  GOOGLE_LOG(FATAL) << "GenerateParsingCodeFromPacked() "
             << "called on field generator that does not support packing.";
}